

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_ipairs_aux(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  TRef TVar2;
  int iVar3;
  TValue local_f0;
  RecordIndex ix;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  if (((uint)ix.oldv & 0x1f000000) == 0xb000000) {
    ix._64_8_ = rd;
    if (0xfffffff2 < (uint)((int)rd->argv[1].field_4.it >> 0xf)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    ix.tabv.n = (lua_Number)((int)rd->argv[1].n + 1);
    local_f0.u64 = rd->argv->u64 & 0x7fffffffffff | 0xfffa000000000000;
    ix.tab = 0;
    ix.mt = 0;
    ix.oldv._4_4_ = lj_opt_narrow_toint(J,J->base[1]);
    IVar1 = (IRRef1)ix.oldv._4_4_;
    TVar2 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    ix.oldv._4_4_ = lj_opt_fold(J);
    *J->base = ix.oldv._4_4_;
    TVar2 = lj_record_idx(J,(RecordIndex *)&local_f0.gcr);
    J->base[1] = TVar2;
    iVar3 = 2;
    if ((J->base[1] & 0x1f000000) == 0) {
      iVar3 = 0;
    }
    *(long *)(ix._64_8_ + 8) = (long)iVar3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs_aux(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  if (tref_istab(ix.tab)) {
    if (!tvisnumber(&rd->argv[1]))  /* No support for string coercion. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    setintV(&ix.keyv, numberVint(&rd->argv[1])+1);
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    ix.val = 0; ix.idxchain = 0;
    ix.key = lj_opt_narrow_toint(J, J->base[1]);
    J->base[0] = ix.key = emitir(IRTI(IR_ADD), ix.key, lj_ir_kint(J, 1));
    J->base[1] = lj_record_idx(J, &ix);
    rd->nres = tref_isnil(J->base[1]) ? 0 : 2;
  }  /* else: Interpreter will throw. */
}